

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  ulong uVar7;
  uint *puVar8;
  int iVar9;
  uint *puVar10;
  undefined4 *puVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  undefined1 auVar18 [64];
  
  uVar1 = a->c;
  iVar9 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar12 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    uVar17 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar17 = 0;
    }
    for (uVar7 = 0; uVar7 != uVar17; uVar7 = uVar7 + 1) {
      pvVar2 = a->data;
      pvVar3 = b->data;
      pvVar4 = c->data;
      lVar15 = a->elemsize * a->cstep * uVar7;
      lVar14 = b->elemsize * b->cstep * uVar7;
      lVar13 = c->elemsize * c->cstep * uVar7;
      lVar16 = 0;
      for (iVar12 = 0; iVar12 + 0xf < iVar9; iVar12 = iVar12 + 0x10) {
        auVar18 = vminps_avx512f(*(undefined1 (*) [64])((long)pvVar2 + lVar16 + lVar15),
                                 *(undefined1 (*) [64])((long)pvVar3 + lVar16 + lVar14));
        *(undefined1 (*) [64])((long)pvVar4 + lVar16 + lVar13) = auVar18;
        lVar16 = lVar16 + 0x40;
      }
      for (; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar5 = vminps_avx(*(undefined1 (*) [32])((long)pvVar2 + lVar16 + lVar15),
                            *(undefined1 (*) [32])((long)pvVar3 + lVar16 + lVar14));
        *(undefined1 (*) [32])((long)pvVar4 + lVar16 + lVar13) = auVar5;
        lVar16 = lVar16 + 0x20;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar6 = vminps_avx(*(undefined1 (*) [16])((long)pvVar2 + lVar16 + lVar15),
                            *(undefined1 (*) [16])((long)pvVar3 + lVar16 + lVar14));
        *(undefined1 (*) [16])((long)pvVar4 + lVar16 + lVar13) = auVar6;
        lVar16 = lVar16 + 0x10;
      }
      puVar8 = (uint *)((long)pvVar2 + lVar15 + lVar16);
      puVar10 = (uint *)((long)pvVar3 + lVar14 + lVar16);
      puVar11 = (undefined4 *)((long)pvVar4 + lVar13 + lVar16);
      for (; iVar12 < iVar9; iVar12 = iVar12 + 1) {
        auVar6 = vminss_avx(ZEXT416(*puVar10),ZEXT416(*puVar8));
        *puVar11 = auVar6._0_4_;
        puVar8 = puVar8 + 1;
        puVar10 = puVar10 + 1;
        puVar11 = puVar11 + 1;
      }
    }
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}